

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArcSineDifferentiationTest.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  double extraout_XMM0_Qa;
  Variable x;
  UnaryExpression local_a0;
  Expression local_88;
  Variable local_70;
  double local_58;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  Kandinsky::Variable::Variable(&local_70);
  (local_70.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       0.5;
  Kandinsky::asin<Kandinsky::Variable,_nullptr>((ArcSineExpression *)&local_a0,&local_70);
  Kandinsky::BaseExpression::differentiate(&local_88,&local_a0.super_BaseExpression,&local_70);
  (**(local_88.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  local_58 = extraout_XMM0_Qa;
  std::__cxx11::to_string(&local_48,1.1547005383792517);
  std::operator+(&local_28,"x = 0.5; d(asin(x))/dx != ",&local_48);
  Kandinsky::assertOrExit(ABS(local_58 + -1.1547005383792517) < 0.0001,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  Kandinsky::Expression::~Expression(&local_88);
  Kandinsky::UnaryExpression::~UnaryExpression(&local_a0);
  Kandinsky::Variable::~Variable(&local_70);
  return 0;
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    x.setValue(0.5);
    assertOrExit(std::abs((asin(x)).differentiate(x).evaluate() - 1. /  std::sqrt(1. - 0.5 * 0.5)) < 1.e-4, "x = 0.5; d(asin(x))/dx != " + std::to_string(1. / std::sqrt(1. - 0.5 * 0.5)));
    return 0;
}